

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsOutput::output(SmodelsOutput *this,StringSpan *str,LitSpan *cond)

{
  Lit_t LVar1;
  size_t sVar2;
  int *piVar3;
  uint *puVar4;
  ostream *poVar5;
  char *pcVar6;
  Span<int> *in_RDX;
  Span<char> *in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  int rt;
  void *this_00;
  SmodelsOutput *in_stack_ffffffffffffffd0;
  char *pcVar7;
  
  rt = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (1 < *(int *)(in_RDI + 0x14)) {
    fail(-2,"virtual void Potassco::SmodelsOutput::output(const StringSpan &, const LitSpan &)",
         0x153,"sec_ <= 1","adding symbols after compute not supported",0);
  }
  sVar2 = size<int>(in_RDX);
  if (sVar2 == 1) {
    piVar3 = begin<int>(in_RDX);
    LVar1 = Potassco::lit(*piVar3);
    if (0 < LVar1) {
      if (*(int *)(in_RDI + 0x14) == 0) {
        startRule(in_stack_ffffffffffffffd0,rt);
        endRule(in_stack_ffffffffffffffd0);
        *(undefined4 *)(in_RDI + 0x14) = 1;
      }
      this_00 = *(void **)(in_RDI + 8);
      puVar4 = (uint *)Span<int>::operator[](in_RDX,0);
      poVar5 = (ostream *)std::ostream::operator<<(this_00,*puVar4);
      std::operator<<(poVar5," ");
      pcVar7 = *(char **)(in_RDI + 8);
      pcVar6 = begin<char>(in_RSI);
      size<char>(in_RSI);
      std::ostream::write(pcVar7,(long)pcVar6);
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
      return;
    }
  }
  fail(-2,"virtual void Potassco::SmodelsOutput::output(const StringSpan &, const LitSpan &)",0x154,
       "size(cond) == 1 && lit(*begin(cond)) > 0",
       "general output directive not supported in smodels format",0);
}

Assistant:

void SmodelsOutput::output(const StringSpan& str, const LitSpan& cond) {
	POTASSCO_REQUIRE(sec_ <= 1, "adding symbols after compute not supported");
	POTASSCO_REQUIRE(size(cond) == 1 && lit(*begin(cond)) > 0, "general output directive not supported in smodels format");
	if (sec_ == 0) { startRule(End).endRule(); sec_ = 1; }
	os_ << unsigned(cond[0]) << " ";
	os_.write(begin(str), size(str));
	os_ << "\n";
}